

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool trans_LDRD_rr(DisasContext_conflict1 *s,arg_ldst_rr *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  int index;
  int iVar1;
  TCGv_i32 a32;
  TCGv_i32 pTVar2;
  TCGv_i32 tmp;
  TCGv_i32 addr;
  int mem_idx;
  TCGContext_conflict1 *tcg_ctx;
  arg_ldst_rr *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  index = get_mem_index(s);
  iVar1 = arm_dc_feature(s,0xf);
  if (iVar1 == 0) {
    s_local._7_1_ = false;
  }
  else if ((a->rt & 1U) == 0) {
    a32 = op_addr_rr_pre(s,a);
    pTVar2 = tcg_temp_new_i32(tcg_ctx_00);
    gen_aa32_ld_i32(s,pTVar2,a32,index,s->be_data | MO_32);
    store_reg(s,a->rt,pTVar2);
    tcg_gen_addi_i32_aarch64(tcg_ctx_00,a32,a32,4);
    pTVar2 = tcg_temp_new_i32(tcg_ctx_00);
    gen_aa32_ld_i32(s,pTVar2,a32,index,s->be_data | MO_32);
    store_reg(s,a->rt + 1,pTVar2);
    op_addr_rr_post(s,a,a32,-4);
    s_local._7_1_ = true;
  }
  else {
    unallocated_encoding_aarch64(s);
    s_local._7_1_ = true;
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_LDRD_rr(DisasContext *s, arg_ldst_rr *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int mem_idx = get_mem_index(s);
    TCGv_i32 addr, tmp;

    if (!ENABLE_ARCH_5TE) {
        return false;
    }
    if (a->rt & 1) {
        unallocated_encoding(s);
        return true;
    }
    addr = op_addr_rr_pre(s, a);

    tmp = tcg_temp_new_i32(tcg_ctx);
    gen_aa32_ld_i32(s, tmp, addr, mem_idx, MO_UL | s->be_data);
    store_reg(s, a->rt, tmp);

    tcg_gen_addi_i32(tcg_ctx, addr, addr, 4);

    tmp = tcg_temp_new_i32(tcg_ctx);
    gen_aa32_ld_i32(s, tmp, addr, mem_idx, MO_UL | s->be_data);
    store_reg(s, a->rt + 1, tmp);

    /* LDRD w/ base writeback is undefined if the registers overlap.  */
    op_addr_rr_post(s, a, addr, -4);
    return true;
}